

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O3

void __thiscall despot::AEMS::belief(AEMS *this,Belief *b)

{
  VNode *this_00;
  
  (this->super_Solver).belief_ = b;
  std::vector<int,_std::allocator<int>_>::resize(&(this->super_Solver).history_.actions_,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&(this->super_Solver).history_.observations_,0);
  this_00 = this->root_;
  if (this_00 != (VNode *)0x0) {
    VNode::~VNode(this_00);
  }
  operator_delete(this_00,0x98);
  this->root_ = (VNode *)0x0;
  return;
}

Assistant:

void AEMS::belief(Belief* b) {
	belief_ = b;
	history_.Truncate(0);
	delete root_;
	root_ = NULL;
}